

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O0

void FileWatcherRemoveAllWatches(HFileWatcher handle)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  FileWatcher *watcher;
  HFileWatcher handle_local;
  
  guard._M_device = (mutex_type *)handle;
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)((long)handle + 0x38));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&((guard._M_device)->super___mutex_base)._M_mutex + 0x10));
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void FileWatcherRemoveAllWatches(HFileWatcher handle) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    watcher->Watches.clear();
}